

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_stream.c
# Opt level: O3

void PaUtil_InitializeStreamRepresentation
               (PaUtilStreamRepresentation *streamRepresentation,
               PaUtilStreamInterface *streamInterface,PaStreamCallback *streamCallback,
               void *userData)

{
  streamRepresentation->magic = 0x18273645;
  streamRepresentation->nextOpenStream = (PaUtilStreamRepresentation *)0x0;
  streamRepresentation->streamInterface = streamInterface;
  streamRepresentation->streamCallback = streamCallback;
  streamRepresentation->streamFinishedCallback = (PaStreamFinishedCallback *)0x0;
  streamRepresentation->userData = userData;
  (streamRepresentation->streamInfo).inputLatency = 0.0;
  (streamRepresentation->streamInfo).outputLatency = 0.0;
  (streamRepresentation->streamInfo).sampleRate = 0.0;
  return;
}

Assistant:

void PaUtil_InitializeStreamRepresentation( PaUtilStreamRepresentation *streamRepresentation,
        PaUtilStreamInterface *streamInterface,
        PaStreamCallback *streamCallback,
        void *userData )
{
    streamRepresentation->magic = PA_STREAM_MAGIC;
    streamRepresentation->nextOpenStream = 0;
    streamRepresentation->streamInterface = streamInterface;
    streamRepresentation->streamCallback = streamCallback;
    streamRepresentation->streamFinishedCallback = 0;

    streamRepresentation->userData = userData;

    streamRepresentation->streamInfo.inputLatency = 0.;
    streamRepresentation->streamInfo.outputLatency = 0.;
    streamRepresentation->streamInfo.sampleRate = 0.;
}